

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O3

UnaryOperator * __thiscall
LLVMBC::LLVMContext::
construct<LLVMBC::UnaryOperator,LLVMBC::UnaryOperator::UnaryOps,LLVMBC::Value*&>
          (LLVMContext *this,UnaryOps *u,Value **u_1)

{
  UnaryOperator *this_00;
  
  this_00 = (UnaryOperator *)allocate(this,0x78,8);
  if (this_00 != (UnaryOperator *)0x0) {
    UnaryOperator::UnaryOperator(this_00,*u,*u_1);
    append_typed_destructor<LLVMBC::UnaryOperator>(this,this_00);
    return this_00;
  }
  std::terminate();
}

Assistant:

T *construct(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);

		if (!std::is_trivially_destructible<T>::value)
			append_typed_destructor(t);
		return t;
	}